

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

bool __thiscall CBlockPolicyEstimator::Read(CBlockPolicyEstimator *this,AutoFile *filein)

{
  vector<double,_std::allocator<double>_> *defaultBuckets;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *this_00;
  long lVar1;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  TxConfirmStats *pTVar6;
  TxConfirmStats *pTVar7;
  __uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true> _Var8;
  pointer pdVar9;
  mapped_type_conflict *pmVar10;
  runtime_error *prVar11;
  size_t in_RCX;
  int nFileVersion;
  int nFileVersion_00;
  int nFileVersion_01;
  vector<double,_std::allocator<double>_> *v;
  size_t numBuckets;
  ulong uVar12;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> fileLongStats;
  unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> fileShortStats;
  uint32_t obj;
  int nVersionRequired;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  vector<double,_std::allocator<double>_> fileBuckets;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock7.super_unique_lock._M_device = &(this->m_cs_fee_estimator).super_mutex;
  criticalblock7.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock7.super_unique_lock);
  AutoFile::read(filein,(int)&obj,(void *)0x4,in_RCX);
  nVersionRequired = obj;
  AutoFile::read(filein,(int)&obj,(void *)0x4,in_RCX);
  if (0x46c6c < nVersionRequired) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<int>
              ((string *)&fileBuckets,"up-version (%d) fee estimate file",&nVersionRequired);
    std::runtime_error::runtime_error(prVar11,(string *)&fileBuckets);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00989c76;
  }
  AutoFile::read(filein,(int)&obj,(void *)0x4,in_RCX);
  if (nVersionRequired < 0x2498c) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
    ;
    source_file._M_len = 0x5f;
    logging_function._M_str = "Read";
    logging_function._M_len = 4;
    LogPrintFormatInternal<char[5],int>
              (logging_function,source_file,0x3e9,ALL,Info,(ConstevalFormatString<2U>)0xfba16d,
               (char (*) [5])"Read",&nVersionRequired);
  }
  else {
    uVar3 = obj;
    AutoFile::read(filein,(int)&obj,(void *)0x4,in_RCX);
    uVar4 = obj;
    AutoFile::read(filein,(int)&obj,(void *)0x4,in_RCX);
    uVar5 = obj;
    if ((obj < uVar4) || (uVar3 < obj)) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar11,"Corrupt estimates file. Historical block range for estimates is invalid");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00989c76;
    }
    fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
    Unser<AutoFile,std::vector<double,std::allocator<double>>>
              ((VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *)filein,
               (AutoFile *)&fileBuckets,v);
    numBuckets = (long)fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
    if (numBuckets - 0x3e9 < 0xfffffffffffffc19) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar11,"Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00989c76;
    }
    pTVar7 = (TxConfirmStats *)operator_new(0xb0);
    defaultBuckets = &this->buckets;
    this_00 = &this->bucketMap;
    TxConfirmStats::TxConfirmStats(pTVar7,defaultBuckets,this_00,0x18,0.9952,2);
    _obj = pTVar7;
    _Var8.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)operator_new(0xb0);
    TxConfirmStats::TxConfirmStats
              ((TxConfirmStats *)
               _Var8.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
               _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,defaultBuckets,this_00,
               0xc,0.962,1);
    fileShortStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         _Var8.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
         super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    _Var8.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)operator_new(0xb0);
    TxConfirmStats::TxConfirmStats
              ((TxConfirmStats *)
               _Var8.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
               _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,defaultBuckets,this_00,
               0x2a,0.99931,0x18);
    fileLongStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         _Var8.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
         super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    TxConfirmStats::Read(_obj,filein,nFileVersion,numBuckets);
    TxConfirmStats::Read
              ((TxConfirmStats *)
               fileShortStats._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,filein,nFileVersion_00,
               numBuckets);
    TxConfirmStats::Read
              ((TxConfirmStats *)
               fileLongStats._M_t.
               super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
               super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
               super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,filein,nFileVersion_01,
               numBuckets);
    std::vector<double,_std::allocator<double>_>::operator=(defaultBuckets,&fileBuckets);
    std::
    _Rb_tree<double,_std::pair<const_double,_unsigned_int>,_std::_Select1st<std::pair<const_double,_unsigned_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
    ::clear(&this_00->_M_t);
    pdVar9 = (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar9) {
      uVar12 = 0;
      do {
        pmVar10 = std::
                  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
                  ::operator[](this_00,pdVar9 + uVar12);
        *pmVar10 = (mapped_type_conflict)uVar12;
        uVar12 = (ulong)((mapped_type_conflict)uVar12 + 1);
        pdVar9 = (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar12 < (ulong)((long)(this->buckets).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar9 >> 3));
    }
    pTVar6 = _obj;
    _obj = (TxConfirmStats *)0x0;
    pTVar7 = (this->feeStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    (this->feeStats)._M_t.
    super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = pTVar6;
    if (pTVar7 != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&this->feeStats,pTVar7);
    }
    uVar2._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         fileShortStats._M_t.
         super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
         super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    fileShortStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)0x0;
    pTVar7 = (this->shortStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    (this->shortStats)._M_t.
    super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (TxConfirmStats *)
         uVar2._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t
         .super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    if (pTVar7 != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&this->shortStats,pTVar7);
    }
    uVar2._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         fileLongStats._M_t.
         super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
         super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    fileLongStats._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
    _M_t.super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (__uniq_ptr_data<TxConfirmStats,_std::default_delete<TxConfirmStats>,_true,_true>)
         (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)0x0;
    pTVar7 = (this->longStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    (this->longStats)._M_t.
    super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl =
         (TxConfirmStats *)
         uVar2._M_t.super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t
         .super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
         super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    if (pTVar7 != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&this->longStats,pTVar7);
    }
    this->nBestSeenHeight = uVar3;
    this->historicalFirst = uVar4;
    this->historicalBest = uVar5;
    if ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)
        fileLongStats._M_t.
        super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
        super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
        super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&fileLongStats,
                 (TxConfirmStats *)
                 fileLongStats._M_t.
                 super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
                 super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
                 super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl);
    }
    if ((__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)
        fileShortStats._M_t.
        super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
        super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
        super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&fileShortStats,
                 (TxConfirmStats *)
                 fileShortStats._M_t.
                 super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
                 super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
                 super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl);
    }
    if (_obj != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()((default_delete<TxConfirmStats> *)&obj,_obj);
    }
    if (fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)fileBuckets.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
LAB_00989c76:
  __stack_chk_fail();
}

Assistant:

bool CBlockPolicyEstimator::Read(AutoFile& filein)
{
    try {
        LOCK(m_cs_fee_estimator);
        int nVersionRequired, nVersionThatWrote;
        filein >> nVersionRequired >> nVersionThatWrote;
        if (nVersionRequired > CLIENT_VERSION) {
            throw std::runtime_error(strprintf("up-version (%d) fee estimate file", nVersionRequired));
        }

        // Read fee estimates file into temporary variables so existing data
        // structures aren't corrupted if there is an exception.
        unsigned int nFileBestSeenHeight;
        filein >> nFileBestSeenHeight;

        if (nVersionRequired < 149900) {
            LogPrintf("%s: incompatible old fee estimation data (non-fatal). Version: %d\n", __func__, nVersionRequired);
        } else { // New format introduced in 149900
            unsigned int nFileHistoricalFirst, nFileHistoricalBest;
            filein >> nFileHistoricalFirst >> nFileHistoricalBest;
            if (nFileHistoricalFirst > nFileHistoricalBest || nFileHistoricalBest > nFileBestSeenHeight) {
                throw std::runtime_error("Corrupt estimates file. Historical block range for estimates is invalid");
            }
            std::vector<double> fileBuckets;
            filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(fileBuckets);
            size_t numBuckets = fileBuckets.size();
            if (numBuckets <= 1 || numBuckets > 1000) {
                throw std::runtime_error("Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
            }

            std::unique_ptr<TxConfirmStats> fileFeeStats(new TxConfirmStats(buckets, bucketMap, MED_BLOCK_PERIODS, MED_DECAY, MED_SCALE));
            std::unique_ptr<TxConfirmStats> fileShortStats(new TxConfirmStats(buckets, bucketMap, SHORT_BLOCK_PERIODS, SHORT_DECAY, SHORT_SCALE));
            std::unique_ptr<TxConfirmStats> fileLongStats(new TxConfirmStats(buckets, bucketMap, LONG_BLOCK_PERIODS, LONG_DECAY, LONG_SCALE));
            fileFeeStats->Read(filein, nVersionThatWrote, numBuckets);
            fileShortStats->Read(filein, nVersionThatWrote, numBuckets);
            fileLongStats->Read(filein, nVersionThatWrote, numBuckets);

            // Fee estimates file parsed correctly
            // Copy buckets from file and refresh our bucketmap
            buckets = fileBuckets;
            bucketMap.clear();
            for (unsigned int i = 0; i < buckets.size(); i++) {
                bucketMap[buckets[i]] = i;
            }

            // Destroy old TxConfirmStats and point to new ones that already reference buckets and bucketMap
            feeStats = std::move(fileFeeStats);
            shortStats = std::move(fileShortStats);
            longStats = std::move(fileLongStats);

            nBestSeenHeight = nFileBestSeenHeight;
            historicalFirst = nFileHistoricalFirst;
            historicalBest = nFileHistoricalBest;
        }
    }
    catch (const std::exception& e) {
        LogPrintf("CBlockPolicyEstimator::Read(): unable to read policy estimator data (non-fatal): %s\n",e.what());
        return false;
    }
    return true;
}